

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes
          (XmlUnitTestResultPrinter *this,TestResult *result)

{
  EmptyTestEventListener EVar1;
  size_t sVar2;
  TestProperty *pTVar3;
  size_t sVar4;
  size_t extraout_RDX;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar6;
  ostream *poVar7;
  char *pcVar8;
  int i;
  String SVar9;
  Message attributes;
  char local_51;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  XmlUnitTestResultPrinter local_48;
  size_t sVar5;
  
  local_48.output_file_.length_ = (size_t)this;
  Message::Message((Message *)&local_50);
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    i = 0;
    do {
      pTVar3 = TestResult::GetTestProperty(result,i);
      poVar7 = (ostream *)(local_50.ptr_ + 0x10);
      if (local_50.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar8 = (pTVar3->key_).c_str_;
      if (pcVar8 == (char *)0x0) {
        sVar6.ptr_ = local_50.ptr_ + 0x10;
        sVar4 = 6;
        pcVar8 = "(null)";
      }
      else {
        sVar6.ptr_ = local_50.ptr_;
        if (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar6.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_50.ptr_ + 0x10);
        }
        sVar4 = strlen(pcVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar6.ptr_,pcVar8,sVar4);
      poVar7 = (ostream *)(local_50.ptr_ + 0x10);
      if (local_50.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"=",1);
      poVar7 = (ostream *)(local_50.ptr_ + 0x10);
      if (local_50.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      EscapeXml(&local_48,(pTVar3->value_).c_str_,true);
      EVar1.super_TestEventListener._vptr_TestEventListener =
           (TestEventListener)(TestEventListener)local_48.super_EmptyTestEventListener;
      poVar7 = (ostream *)(local_50.ptr_ + 0x10);
      if (local_50.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      if (local_48.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener ==
          (_func_int **)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(null)",6);
      }
      else if (local_48.output_file_.c_str_ != (char *)0x0) {
        pcVar8 = (char *)0x0;
        do {
          if (*(char *)((long)EVar1.super_TestEventListener._vptr_TestEventListener + (long)pcVar8)
              == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\0",2);
          }
          else {
            local_51 = *(char *)((long)EVar1.super_TestEventListener._vptr_TestEventListener +
                                (long)pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_51,1);
          }
          pcVar8 = pcVar8 + 1;
        } while (pcVar8 != local_48.output_file_.c_str_);
      }
      poVar7 = (ostream *)(local_50.ptr_ + 0x10);
      if (local_50.ptr_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      if (local_48.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
          (_func_int **)0x0) {
        operator_delete__((void *)local_48.super_EmptyTestEventListener.super_TestEventListener.
                                  _vptr_TestEventListener);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(result->test_properties_).
                                     super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(result->test_properties_).
                                    super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  sVar2 = local_48.output_file_.length_;
  SVar9 = StringStreamToString((internal *)local_48.output_file_.length_,local_50.ptr_);
  sVar5 = SVar9.length_;
  if (local_50.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50.ptr_ + 8))();
    sVar5 = extraout_RDX;
  }
  SVar9.length_ = sVar5;
  SVar9.c_str_ = (char *)sVar2;
  return SVar9;
}

Assistant:

String XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}